

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

ConnectionSyntax __thiscall
CPP::WriteInitialization::connectionSyntax
          (WriteInitialization *this,SignalSlot *sender,SignalSlot *receiver)

{
  initializer_list<QString> args;
  bool bVar1;
  int iVar2;
  WriteInitialization *this_00;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  char16_t *str;
  undefined4 in_stack_ffffffffffffff38;
  CaseSensitivity in_stack_ffffffffffffff3c;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar5;
  iterator in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  long *plVar6;
  long *local_a0;
  ConnectionSyntax local_54;
  QArrayDataPointer<char16_t> local_38;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((**(ushort **)(in_RDI + 0x20) >> 9 & 1) == 0) {
    if ((**(ushort **)(in_RDI + 0x20) >> 10 & 1) == 0) {
      if ((connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)::
           requiresStringSyntax == '\0') &&
         (iVar2 = __cxa_guard_acquire(&connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)
                                       ::requiresStringSyntax), iVar2 != 0)) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"QAxWidget",9);
        QString::QString((QString *)in_stack_ffffffffffffff40,
                         (DataPointer *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        args._M_len = in_stack_ffffffffffffff58;
        args._M_array = in_stack_ffffffffffffff50;
        QList<QString>::QList
                  ((QList<QString> *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   args);
        plVar6 = local_20;
        local_a0 = &local_8;
        do {
          local_a0 = local_a0 + -3;
          QString::~QString((QString *)0x141d35);
        } while (local_a0 != plVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff40);
        __cxa_atexit(QList<QString>::~QList,&connectionSyntax::requiresStringSyntax,&__dso_handle);
        __cxa_guard_release(&connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)
                             ::requiresStringSyntax);
      }
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)
                         CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                         (QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if ((bVar1) ||
         (bVar1 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)
                             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                             (QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c), bVar1)
         ) {
        local_54 = StringBased;
      }
      else {
        bVar1 = ::operator==((QString *)in_stack_ffffffffffffff40,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if (((bVar1) &&
            (bVar1 = QListSpecialMethods<QString>::contains
                               ((QListSpecialMethods<QString> *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                                (QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c),
            bVar1)) ||
           ((bVar1 = ::operator==((QString *)in_stack_ffffffffffffff40,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
            bVar1 && (bVar1 = QListSpecialMethods<QString>::contains
                                        ((QListSpecialMethods<QString> *)
                                         CONCAT17(in_stack_ffffffffffffff4f,
                                                  in_stack_ffffffffffffff48),
                                         (QString *)in_stack_ffffffffffffff40,
                                         in_stack_ffffffffffffff3c), bVar1)))) {
          local_54 = StringBased;
        }
        else {
          this_00 = (WriteInitialization *)(in_RSI + 0x18);
          QVar4 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                             (size_t)this_00);
          uVar3 = QString::endsWith((QLatin1String *)this_00,(CaseSensitivity)QVar4.m_size);
          bVar5 = 1;
          if ((uVar3 & 1) == 0) {
            bVar1 = isCustomWidget(this_00,(QString *)
                                           CONCAT44(in_stack_ffffffffffffff3c,
                                                    in_stack_ffffffffffffff38));
            bVar5 = 0;
            if (!bVar1) {
              bVar1 = isCustomWidget(this_00,(QString *)
                                             (CONCAT44(in_stack_ffffffffffffff3c,
                                                       in_stack_ffffffffffffff38) & 0xffffffffffffff
                                             ));
              bVar5 = bVar1 ^ 0xff;
            }
          }
          local_54 = (ConnectionSyntax)((bVar5 & 1) != 0);
        }
      }
    }
    else {
      local_54 = StringBased;
    }
  }
  else {
    local_54 = MemberFunctionPtr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

ConnectionSyntax WriteInitialization::connectionSyntax(const language::SignalSlot &sender,
                                                       const language::SignalSlot &receiver) const
{
    if (m_option.forceMemberFnPtrConnectionSyntax)
        return ConnectionSyntax::MemberFunctionPtr;
    if (m_option.forceStringConnectionSyntax)
        return ConnectionSyntax::StringBased;
    // Auto mode: Use Qt 5 connection syntax for Qt classes and parameterless
    // connections. QAxWidget is special though since it has a fake Meta object.
    static const QStringList requiresStringSyntax{QStringLiteral("QAxWidget")};
    if (requiresStringSyntax.contains(sender.className)
        || requiresStringSyntax.contains(receiver.className)) {
        return ConnectionSyntax::StringBased;
    }

    if ((sender.name == m_mainFormVarName && m_customSignals.contains(sender.signature))
         || (receiver.name == m_mainFormVarName && m_customSlots.contains(receiver.signature))) {
        return ConnectionSyntax::StringBased;
    }

    return sender.signature.endsWith("()"_L1)
        || (!isCustomWidget(sender.className) && !isCustomWidget(receiver.className))
        ? ConnectionSyntax::MemberFunctionPtr : ConnectionSyntax::StringBased;
}